

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::ColumnDescriptor>::construct
          (BasicTypeInfo<dap::ColumnDescriptor> *this,void *ptr)

{
  memset((void *)((long)ptr + 0x10),0,0x90);
  *(void **)ptr = (void *)((long)ptr + 0x10);
  *(undefined8 *)((long)ptr + 8) = 0;
  *(long *)((long)ptr + 0x20) = (long)ptr + 0x30;
  *(undefined1 *)((long)ptr + 0x30) = 0;
  *(long *)((long)ptr + 0x48) = (long)ptr + 0x58;
  *(undefined1 *)((long)ptr + 0x58) = 0;
  *(long *)((long)ptr + 0x68) = (long)ptr + 0x78;
  *(undefined1 *)((long)ptr + 0x78) = 0;
  *(undefined8 *)((long)ptr + 0x90) = 0;
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }